

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall JetHead::Socket::connectAsync(Socket *this,Address *addr)

{
  uint uVar1;
  int iVar2;
  sockaddr *__addr;
  int *piVar3;
  sockaddr *saddr;
  int back_err;
  int saveflags;
  int res;
  int len_addr;
  Address *addr_local;
  Socket *this_local;
  
  saveflags = 0;
  _res = addr;
  addr_local = (Address *)this;
  __addr = Address::getAddr(addr,&saveflags);
  uVar1 = fcntl(this->mFd,3,0);
  if ((int)uVar1 < 0) {
    this_local._4_4_ = -1;
  }
  else {
    iVar2 = fcntl(this->mFd,4,(ulong)(uVar1 | 0x800));
    if (iVar2 < 0) {
      this_local._4_4_ = -1;
    }
    else {
      iVar2 = ::connect(this->mFd,(sockaddr *)__addr,saveflags);
      piVar3 = __errno_location();
      if ((iVar2 < 0) && (*piVar3 != 0x73)) {
        this_local._4_4_ = -1;
      }
      else {
        this->mConnectedAsync = true;
        setConnected(this,true,5);
        iVar2 = fcntl(this->mFd,4,(ulong)uVar1);
        if (iVar2 < 0) {
          this_local._4_4_ = -1;
        }
        else {
          this_local._4_4_ = 0;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int Socket::connectAsync( const Socket::Address &addr )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	int len_addr = 0;
	int res = 0;
	int saveflags, back_err;
	const struct sockaddr *saddr = addr.getAddr( len_addr );

	saveflags=fcntl(mFd,F_GETFL,0);

	if( saveflags < 0 ) {
		return -1;
	}

	/* Set non blocking */
	if(fcntl(mFd,F_SETFL,saveflags|O_NONBLOCK)<0) {
		return -1;
	}

	// Attempt it
	res = ::connect( mFd, saddr, len_addr );
	back_err=errno;

	/* return unless the connection was successful or the connect is
	still in progress. */
	if(res<0 && back_err!=EINPROGRESS) {
		return -1;
	}
	
	// Remember that we were connected in this fashion
	mConnectedAsync = true;

	// We need to hear POLLOUT once in order to inform us that the
	// socket has connected.  Once we get that once, we will want to
	// unregister for POLLOUT, otherwise we'll get it all the time.
	setConnected( true, POLLIN|POLLOUT );


	/* Turn off non-blocking */
	if(fcntl(mFd,F_SETFL,saveflags)<0) {
		return -1;
	}

	return 0;
}